

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O1

timespec timespec_normalise(timespec ts)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  timespec tVar5;
  
  lVar3 = ts.tv_nsec;
  lVar4 = ts.tv_sec;
  if (999999999 < lVar3) {
    lVar1 = 1999999999;
    if (lVar3 < 1999999999) {
      lVar1 = lVar3;
    }
    uVar2 = ((lVar3 - lVar1) + 999999999U) / 1000000000;
    lVar4 = lVar4 + uVar2 + 1;
    lVar3 = lVar3 + -1000000000 + uVar2 * -1000000000;
  }
  if (lVar3 < -999999999) {
    lVar1 = -1999999999;
    if (-1999999999 < lVar3) {
      lVar1 = lVar3;
    }
    uVar2 = ((lVar1 - lVar3) - (ulong)(lVar3 < -1999999999)) / 1000000000 +
            (ulong)(lVar3 < -1999999999);
    lVar4 = lVar4 + ~uVar2;
    lVar3 = lVar3 + 1000000000 + uVar2 * 1000000000;
  }
  lVar1 = lVar3 + 1000000000;
  if (-1 < lVar3) {
    lVar1 = lVar3;
  }
  tVar5.tv_nsec = lVar1;
  tVar5.tv_sec = (lVar3 >> 0x3f) + lVar4;
  return tVar5;
}

Assistant:

static struct timespec timespec_normalise(struct timespec ts)
{
	while (ts.tv_nsec >= NSEC_PER_SEC) {
		++(ts.tv_sec);
		ts.tv_nsec -= NSEC_PER_SEC;
	}

	while (ts.tv_nsec <= -NSEC_PER_SEC) {
		--(ts.tv_sec);
		ts.tv_nsec += NSEC_PER_SEC;
	}

	if (ts.tv_nsec < 0) {
		/*
		 * Negative nanoseconds isn't valid according to
		 * POSIX. Decrement tv_sec and roll tv_nsec over.
		 */

		--(ts.tv_sec);
		ts.tv_nsec = (NSEC_PER_SEC + ts.tv_nsec);
	}

	return ts;
}